

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

uint Extra_TruthPermute(uint Truth,char *pPerms,int nVars,int fReverse)

{
  int nMints_00;
  int *pMints_00;
  int *pMintsP_00;
  int local_44;
  int local_40;
  int m;
  int i;
  int nMints;
  int *pMintsP;
  int *pMints;
  uint Result;
  int fReverse_local;
  int nVars_local;
  char *pPerms_local;
  uint Truth_local;
  
  if (5 < nVars) {
    __assert_fail("nVars < 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                  ,0x168,"unsigned int Extra_TruthPermute(unsigned int, char *, int, int)");
  }
  nMints_00 = 1 << ((byte)nVars & 0x1f);
  pMints_00 = (int *)malloc((long)nMints_00 << 2);
  pMintsP_00 = (int *)malloc((long)nMints_00 << 2);
  for (local_40 = 0; local_40 < nMints_00; local_40 = local_40 + 1) {
    pMints_00[local_40] = local_40;
  }
  Extra_TruthPermute_int(pMints_00,nMints_00,pPerms,nVars,pMintsP_00);
  pMints._4_4_ = 0;
  if (fReverse == 0) {
    for (local_44 = 0; local_44 < nMints_00; local_44 = local_44 + 1) {
      if ((Truth & 1 << ((byte)local_44 & 0x1f)) != 0) {
        pMints._4_4_ = 1 << ((byte)pMintsP_00[local_44] & 0x1f) | pMints._4_4_;
      }
    }
  }
  else {
    for (local_44 = 0; local_44 < nMints_00; local_44 = local_44 + 1) {
      if ((Truth & 1 << ((byte)pMintsP_00[local_44] & 0x1f)) != 0) {
        pMints._4_4_ = 1 << ((byte)local_44 & 0x1f) | pMints._4_4_;
      }
    }
  }
  if (pMints_00 != (int *)0x0) {
    free(pMints_00);
  }
  if (pMintsP_00 != (int *)0x0) {
    free(pMintsP_00);
  }
  return pMints._4_4_;
}

Assistant:

unsigned Extra_TruthPermute( unsigned Truth, char * pPerms, int nVars, int fReverse )
{
    unsigned Result;
    int * pMints;
    int * pMintsP;
    int nMints;
    int i, m;

    assert( nVars < 6 );
    nMints  = (1 << nVars);
    pMints  = ABC_ALLOC( int, nMints );
    pMintsP = ABC_ALLOC( int, nMints );
    for ( i = 0; i < nMints; i++ )
        pMints[i] = i;

    Extra_TruthPermute_int( pMints, nMints, pPerms, nVars, pMintsP );

    Result = 0;
    if ( fReverse )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Truth & (1 << pMintsP[m]) )
                Result |= (1 << m);
    }
    else
    {
        for ( m = 0; m < nMints; m++ )
            if ( Truth & (1 << m) )
                Result |= (1 << pMintsP[m]);
    }

    ABC_FREE( pMints );
    ABC_FREE( pMintsP );

    return Result;
}